

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

FlattenedField *
kj::_::
CopyConstructArray_<capnp::JsonCodec::AnnotatedHandler::FlattenedField,_capnp::JsonCodec::AnnotatedHandler::FlattenedField_*,_true,_false>
::apply(FlattenedField *pos,FlattenedField *start,FlattenedField *end)

{
  uint uVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  FlattenedField *pFVar8;
  anon_union_64_2_a774ebf0_for_OneOf<capnp::StructSchema::Field,_capnp::Type>_3 *paVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ExceptionGuard local_38;
  
  if (start != end) {
    paVar9 = &(start->type).field_1;
    do {
      (pos->ownName).content.ptr = *(char **)((long)paVar9 + -0x30);
      (pos->ownName).content.size_ = *(size_t *)((long)paVar9 + -0x28);
      (pos->ownName).content.disposer = *(ArrayDisposer **)((long)paVar9 + -0x20);
      *(undefined8 *)((long)paVar9 + -0x30) = 0;
      *(undefined8 *)((long)paVar9 + -0x28) = 0;
      sVar2 = *(size_t *)((long)paVar9 + -0x10);
      (pos->name).content.ptr = *(char **)((long)paVar9 + -0x18);
      (pos->name).content.size_ = sVar2;
      uVar1 = ((OneOf<capnp::StructSchema::Field,_capnp::Type> *)((long)paVar9 + -8))->tag;
      (pos->type).tag = uVar1;
      if (uVar1 == 2) {
        uVar10 = *(undefined4 *)paVar9;
        uVar11 = *(undefined4 *)((long)paVar9 + 4);
        uVar12 = *(undefined4 *)((long)paVar9 + 8);
        uVar13 = *(undefined4 *)((long)paVar9 + 0xc);
LAB_001f185f:
        *(undefined4 *)&(pos->type).field_1 = uVar10;
        *(undefined4 *)((long)&(pos->type).field_1 + 4) = uVar11;
        *(undefined4 *)((long)&(pos->type).field_1 + 8) = uVar12;
        *(undefined4 *)((long)&(pos->type).field_1 + 0xc) = uVar13;
      }
      else if (uVar1 == 1) {
        uVar10 = *(undefined4 *)paVar9;
        uVar11 = *(undefined4 *)((long)paVar9 + 4);
        uVar12 = *(undefined4 *)((long)paVar9 + 8);
        uVar13 = *(undefined4 *)((long)paVar9 + 0xc);
        uVar3 = *(undefined8 *)((long)paVar9 + 0x10);
        uVar4 = *(undefined8 *)((long)paVar9 + 0x18);
        uVar5 = *(undefined8 *)((long)paVar9 + 0x20);
        uVar6 = *(undefined8 *)((long)paVar9 + 0x28);
        uVar7 = *(undefined8 *)((long)paVar9 + 0x38);
        *(undefined8 *)((long)&(pos->type).field_1 + 0x30) = *(undefined8 *)((long)paVar9 + 0x30);
        *(undefined8 *)((long)&(pos->type).field_1 + 0x38) = uVar7;
        *(undefined8 *)((long)&(pos->type).field_1 + 0x20) = uVar5;
        *(undefined8 *)((long)&(pos->type).field_1 + 0x28) = uVar6;
        *(undefined8 *)((long)&(pos->type).field_1 + 0x10) = uVar3;
        *(undefined8 *)((long)&(pos->type).field_1 + 0x18) = uVar4;
        goto LAB_001f185f;
      }
      capnp::DynamicValue::Reader::Reader(&pos->value,(Reader *)(paVar9 + 1));
      pos = pos + 1;
      pFVar8 = (FlattenedField *)((long)paVar9 + 0x88);
      paVar9 = (anon_union_64_2_a774ebf0_for_OneOf<capnp::StructSchema::Field,_capnp::Type>_3 *)
               ((long)paVar9 + 0xb8);
    } while (pFVar8 != end);
  }
  local_38.start = pos;
  local_38.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_38);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }